

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRCodecMode.cpp
# Opt level: O0

CodecMode ZXing::QRCode::CodecModeForBits(int bits,Type type)

{
  int iVar1;
  undefined8 uVar2;
  int in_ESI;
  CodecMode in_EDI;
  bool bVar3;
  CodecMode Bits2Mode_1 [8];
  CodecMode Bits2Mode [4];
  CodecMode (*in_stack_ffffffffffffff70) [8];
  CodecMode in_stack_ffffffffffffff78;
  CodecMode in_stack_ffffffffffffff7c;
  Type in_stack_ffffffffffffff85;
  short in_stack_ffffffffffffff86;
  char *in_stack_ffffffffffffff88;
  Error *in_stack_ffffffffffffff90;
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  CodecMode local_48 [16];
  CodecMode local_8;
  
  local_8 = in_EDI;
  if (in_ESI == 2) {
    local_48[8] = NUMERIC;
    local_48[9] = ALPHANUMERIC;
    local_48[10] = BYTE;
    local_48[0xb] = KANJI;
    iVar1 = Size<ZXing::QRCode::CodecMode,4ul>((CodecMode (*) [4])in_stack_ffffffffffffff70);
    if ((int)in_EDI < iVar1) {
      return local_48[(long)(int)local_8 + 8];
    }
  }
  else if (in_ESI == 3) {
    local_48[0] = TERMINATOR;
    local_48[1] = NUMERIC;
    local_48[2] = ALPHANUMERIC;
    local_48[3] = BYTE;
    local_48[4] = KANJI;
    local_48[5] = FNC1_FIRST_POSITION;
    local_48[6] = FNC1_SECOND_POSITION;
    local_48[7] = ECI;
    iVar1 = Size<ZXing::QRCode::CodecMode,8ul>(in_stack_ffffffffffffff70);
    bVar3 = (int)in_EDI < iVar1;
    in_stack_ffffffffffffff78 = in_EDI;
    in_EDI = in_stack_ffffffffffffff7c;
    if (bVar3) {
      return local_48[(int)local_8];
    }
  }
  else {
    if ((-1 < (int)in_EDI) && ((int)in_EDI < 6)) {
      return in_EDI;
    }
    if ((6 < (int)in_EDI) && ((int)in_EDI < 10)) {
      return in_EDI;
    }
    bVar3 = in_EDI == HANZI;
    in_EDI = in_stack_ffffffffffffff7c;
    if (bVar3) {
      return HANZI;
    }
  }
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Error::Error(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff86,
               in_stack_ffffffffffffff85,(string *)CONCAT44(in_EDI,in_stack_ffffffffffffff78));
  __cxa_throw(uVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

CodecMode CodecModeForBits(int bits, Type type)
{
	if (type == Type::Micro) {
		constexpr CodecMode Bits2Mode[4] = {CodecMode::NUMERIC, CodecMode::ALPHANUMERIC, CodecMode::BYTE, CodecMode::KANJI};
		if (bits < Size(Bits2Mode))
			return Bits2Mode[bits];
	} else if (type == Type::rMQR) {
		constexpr CodecMode Bits2Mode[8] = {
			CodecMode::TERMINATOR, CodecMode::NUMERIC, CodecMode::ALPHANUMERIC, CodecMode::BYTE,
			CodecMode::KANJI, CodecMode::FNC1_FIRST_POSITION, CodecMode::FNC1_SECOND_POSITION, CodecMode::ECI
		};
		if (bits < Size(Bits2Mode))
			return Bits2Mode[bits];
	} else {
		if ((bits >= 0x00 && bits <= 0x05) || (bits >= 0x07 && bits <= 0x09) || bits == 0x0d)
			return static_cast<CodecMode>(bits);
	}

	throw FormatError("Invalid codec mode");
}